

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5MultiIterNew(Fts5Index *p,Fts5Structure *pStruct,int flags,Fts5Colset *pColset,u8 *pTerm,
                     int nTerm,int iLevel,int nSegment,Fts5Iter **ppOut)

{
  long lVar1;
  int *piVar2;
  Fts5Hash *p_00;
  Vdbe *p_01;
  sqlite3_mutex *psVar3;
  bool bVar4;
  bool bVar5;
  Fts5StructureLevel *pFVar6;
  Fts5Iter *pFVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  size_t sVar12;
  code *pcVar13;
  char *zSql;
  Mem *pMem;
  ulong uVar14;
  Fts5DlidxIter *pFVar15;
  Fts5Data *pFVar16;
  Fts5Data *pFVar17;
  ushort uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  Fts5Buffer *pFVar22;
  u32 uVar23;
  long lVar24;
  Fts5StructureSegment *pSeg;
  char cVar25;
  Fts5Data *p_02;
  undefined4 in_register_0000008c;
  u8 *puVar26;
  Fts5Index *pFVar27;
  int iVar28;
  Vdbe *p_1;
  Fts5SegIter *pFVar29;
  Fts5Structure *pFVar30;
  uint uVar31;
  Fts5HashEntry *p_03;
  long lVar32;
  bool bVar33;
  int nList;
  u8 *z;
  u32 nKeep;
  u32 local_f4;
  Fts5Index *local_f0;
  int *local_e8;
  byte local_d9;
  u8 *local_d8;
  u8 *local_d0;
  uint local_c8;
  uint local_c4;
  ulong local_c0;
  Fts5Iter *local_b8;
  u8 *local_b0;
  int local_a4;
  Fts5Structure *local_a0;
  Fts5Buffer *local_98;
  int local_8c;
  ulong local_88;
  long local_80;
  long local_78;
  uint local_6c;
  sqlite3_stmt **local_68;
  int local_60;
  u32 local_5c;
  long local_58;
  Fts5Iter **local_50;
  Fts5StructureLevel *local_48;
  Fts5Data *local_40;
  Fts5SegIter *local_38;
  
  local_88 = CONCAT44(in_register_0000008c,nTerm);
  uVar10 = 0;
  if (p->rc == 0) {
    if (iLevel < 0) {
      uVar10 = (pStruct->nSegment + 1) - (uint)(p->pHash == (Fts5Hash *)0x0);
    }
    else {
      uVar31 = pStruct->aLevel[(uint)iLevel].nSeg;
      uVar10 = nSegment;
      if ((int)uVar31 < nSegment) {
        uVar10 = uVar31;
      }
    }
  }
  local_d8 = pTerm;
  local_c8 = flags;
  local_a0 = pStruct;
  local_b8 = fts5MultiIterAlloc(p,uVar10);
  *ppOut = local_b8;
  if (local_b8 != (Fts5Iter *)0x0) {
    local_50 = ppOut;
    piVar2 = &p->rc;
    local_b8->bRev = local_c8 >> 1 & 1;
    local_b8->bSkipEmpty = (byte)local_c8 >> 4 & 1;
    local_b8->pColset = pColset;
    local_f0 = p;
    if ((local_c8 & 0x20) == 0) {
      fts5IterSetOutputCb(piVar2,local_b8);
    }
    pFVar27 = local_f0;
    local_e8 = piVar2;
    if (*piVar2 == 0) {
      if (iLevel < 0) {
        iVar28 = local_a0->nLevel;
        p_00 = local_f0->pHash;
        if (p_00 == (Fts5Hash *)0x0) {
          lVar24 = 0;
        }
        else {
          local_f4 = 0;
          local_d0 = (u8 *)0x0;
          uVar23 = (u32)local_88;
          if ((local_c8 & 8) == 0 && local_d8 != (u8 *)0x0) {
            if ((int)uVar23 < 1) {
              uVar10 = 0xd;
            }
            else {
              lVar24 = (local_88 & 0xffffffff) + 1;
              uVar10 = 0xd;
              do {
                uVar10 = uVar10 * 8 ^ uVar10 ^ (uint)local_d8[lVar24 + -2];
                lVar24 = lVar24 + -1;
              } while (1 < lVar24);
            }
            iVar9 = 0;
            p_03 = p_00->aSlot[(ulong)uVar10 % (ulong)(uint)p_00->nSlot];
            if (p_03 != (Fts5HashEntry *)0x0) {
              do {
                if ((p_03->nKey + 1U == uVar23) &&
                   (iVar11 = bcmp(p_03 + 1,local_d8,(long)(int)uVar23), iVar11 == 0)) {
                  local_c0 = (ulong)(int)(uVar23 + 0x31);
                  lVar24 = (long)p_03->nData - local_c0;
                  iVar9 = sqlite3_initialize();
                  if (iVar9 == 0) {
                    pFVar16 = (Fts5Data *)sqlite3Malloc(lVar24 + 0x1a);
                  }
                  else {
                    pFVar16 = (Fts5Data *)0x0;
                  }
                  if (pFVar16 == (Fts5Data *)0x0) {
                    local_f4 = 0;
                    iVar9 = 7;
                  }
                  else {
                    iVar9 = -0x21 - uVar23;
                    iVar11 = (int)lVar24;
                    memcpy(pFVar16 + 1,(void *)((long)&p_03->pHashNext + local_c0),(long)iVar11);
                    uVar23 = (u32)local_88;
                    iVar9 = fts5HashAddPoslistSize
                                      (p_00,p_03,(Fts5HashEntry *)((long)&pFVar16->p + (long)iVar9))
                    ;
                    local_f4 = iVar11 + iVar9;
                    iVar9 = 0;
                  }
                  goto LAB_001a3913;
                }
                p_03 = p_03->pHashNext;
              } while (p_03 != (Fts5HashEntry *)0x0);
            }
            local_f4 = 0;
            pFVar16 = (Fts5Data *)0x0;
LAB_001a3913:
            *local_e8 = iVar9;
            if (pFVar16 != (Fts5Data *)0x0) {
              pFVar16->p = (u8 *)(pFVar16 + 1);
            }
            local_d0 = local_d8;
            piVar2 = &local_b8->aSeg[0].flags;
            *(byte *)piVar2 = (byte)*piVar2 | 1;
            pFVar27 = local_f0;
          }
          else {
            local_b0 = (u8 *)0x0;
            iVar9 = sqlite3Fts5HashScanInit(p_00,(char *)local_d8,uVar23);
            pFVar27->rc = iVar9;
            sqlite3Fts5HashScanEntry(pFVar27->pHash,(char **)&local_d0,&local_b0,(int *)&local_f4);
            if (local_d0 == (u8 *)0x0) {
              uVar23 = 0;
            }
            else {
              sVar12 = strlen((char *)local_d0);
              uVar23 = (u32)sVar12;
            }
            puVar26 = local_b0;
            if (local_b0 == (u8 *)0x0) {
              pFVar16 = (Fts5Data *)0x0;
            }
            else {
              pFVar16 = (Fts5Data *)sqlite3Fts5MallocZero(local_e8,0x10);
              if (pFVar16 != (Fts5Data *)0x0) {
                pFVar16->p = puVar26;
              }
            }
          }
          pFVar7 = local_b8;
          if (pFVar16 != (Fts5Data *)0x0) {
            pFVar29 = local_b8->aSeg;
            local_b8->aSeg[0].term.n = 0;
            sqlite3Fts5BufferAppendBlob(local_e8,&local_b8->aSeg[0].term,uVar23,local_d0);
            pFVar16->szLeaf = local_f4;
            pFVar16->nn = local_f4;
            pFVar7->aSeg[0].pLeaf = pFVar16;
            bVar8 = sqlite3Fts5GetVarint(pFVar16->p,(u64 *)&pFVar7->aSeg[0].iRowid);
            pFVar7->aSeg[0].iLeafOffset = (uint)bVar8;
            pFVar7->aSeg[0].iEndofDoclist = pFVar16->nn;
            if ((local_c8 & 2) == 0) {
              fts5SegIterLoadNPos(pFVar27,pFVar29);
            }
            else {
              piVar2 = &pFVar7->aSeg[0].flags;
              *(byte *)piVar2 = (byte)*piVar2 | 2;
              fts5SegIterReverseInitPage(pFVar27,pFVar29);
            }
          }
          if ((local_b8->aSeg[0].flags & 2) == 0) {
            if (pFVar27->pConfig->eDetail == 1) {
              pcVar13 = fts5SegIterNext_None;
            }
            else {
              pcVar13 = fts5SegIterNext;
            }
            local_b8->aSeg[0].xNext = pcVar13;
          }
          else {
            local_b8->aSeg[0].xNext = fts5SegIterNext_Reverse;
          }
          lVar24 = 1;
        }
        if (0 < iVar28) {
          local_48 = local_a0->aLevel + iVar28;
          pFVar30 = (Fts5Structure *)local_a0->aLevel;
          local_38 = local_b8->aSeg;
          local_6c = local_c8 & 8;
          local_68 = &local_f0->pIdxSelect;
          puVar26 = local_d8;
          do {
            if (0 < (long)*(int *)&pFVar30->field_0x4) {
              lVar24 = (long)(int)lVar24;
              lVar32 = (long)*(int *)&pFVar30->field_0x4;
              local_a0 = pFVar30;
LAB_001a3aae:
              pFVar27 = local_f0;
              lVar21 = lVar32 + -1;
              pSeg = (Fts5StructureSegment *)(lVar21 * 0xc + pFVar30->nWriteCounter);
              pFVar29 = local_38 + lVar24;
              if (puVar26 != (u8 *)0x0) {
                pFVar29->pSeg = (Fts5StructureSegment *)0x0;
                pFVar29->flags = 0;
                pFVar29->iLeafPgno = 0;
                (pFVar29->term).n = 0;
                (pFVar29->term).nSpace = 0;
                pFVar29->iRowid = 0;
                pFVar29->pDlidx = (Fts5DlidxIter *)0x0;
                (pFVar29->term).p = (u8 *)0x0;
                pFVar29->iRowidOffset = 0;
                pFVar29->nRowidOffset = 0;
                pFVar29->aRowidOffset = (int *)0x0;
                pFVar29->iTermLeafPgno = 0;
                pFVar29->iTermLeafOffset = 0;
                pFVar29->iPgidxOff = 0;
                pFVar29->iEndofDoclist = 0;
                *(undefined8 *)&pFVar29->iLeafOffset = 0;
                pFVar29->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
                pFVar29->pLeaf = (Fts5Data *)0x0;
                pFVar29->pNextLeaf = (Fts5Data *)0x0;
                pFVar29->nPos = 0;
                pFVar29->bDel = '\0';
                *(undefined3 *)&pFVar29->field_0x75 = 0;
                pFVar29->pSeg = pSeg;
                if (*local_68 == (sqlite3_stmt *)0x0) {
                  local_80 = lVar24;
                  zSql = sqlite3_mprintf("SELECT pgno FROM \'%q\'.\'%q_idx\' WHERE segid=? AND term<=? ORDER BY term DESC LIMIT 1"
                                         ,local_f0->pConfig->zDb,local_f0->pConfig->zName);
                  lVar24 = local_80;
                  fts5IndexPrepareStmt(pFVar27,local_68,zSql);
                  puVar26 = local_d8;
                }
                if (*local_e8 != 0) goto LAB_001a412c;
                p_01 = (Vdbe *)*local_68;
                local_8c = 1;
                local_58 = lVar21;
                sqlite3_bind_int64((sqlite3_stmt *)p_01,1,(long)pSeg->iSegid);
                bindText((sqlite3_stmt *)p_01,2,puVar26,(int)local_88,(_func_void_void_ptr *)0x0,
                         '\0');
                iVar28 = sqlite3_step((sqlite3_stmt *)p_01);
                bVar33 = true;
                if (iVar28 == 100) {
                  pMem = columnMem((sqlite3_stmt *)p_01,0);
                  uVar14 = sqlite3VdbeIntValue(pMem);
                  columnMallocFailure((sqlite3_stmt *)p_01);
                  local_8c = (int)uVar14 >> 1;
                  bVar33 = (uVar14 & 1) == 0;
                }
                local_d9 = bVar33;
                iVar28 = sqlite3_reset((sqlite3_stmt *)p_01);
                *local_e8 = iVar28;
                iVar28 = vdbeUnbind(p_01,2);
                pFVar27 = local_f0;
                if ((iVar28 == 0) && (psVar3 = p_01->db->mutex, psVar3 != (sqlite3_mutex *)0x0)) {
                  (*sqlite3Config.mutex.xMutexLeave)(psVar3);
                }
                local_60 = pSeg->pgnoFirst;
                iVar28 = local_60;
                if (local_60 < local_8c) {
                  iVar28 = local_8c;
                }
                pFVar29->iLeafPgno = iVar28 + -1;
                fts5SegIterNextPage(pFVar27,pFVar29);
                pFVar16 = pFVar29->pLeaf;
                if (pFVar16 != (Fts5Data *)0x0) {
                  puVar26 = pFVar16->p;
                  iVar28 = pFVar16->szLeaf;
                  iVar9 = pFVar16->nn;
                  local_b0 = (u8 *)((ulong)local_b0 & 0xffffffff00000000);
                  local_f4 = 0;
                  local_80 = lVar24;
                  local_40 = pFVar16;
                  iVar11 = sqlite3Fts5GetVarint32(puVar26 + iVar28,&local_c4);
                  pFVar22 = (Fts5Buffer *)(ulong)local_c4;
                  local_d0 = (u8 *)CONCAT44(local_d0._4_4_,local_c4);
                  lVar24 = local_80;
                  local_a4 = iVar9;
                  if (iVar9 < (int)local_c4) {
                    *local_e8 = 0x10b;
                    pFVar27 = local_f0;
                  }
                  else {
                    local_c0 = CONCAT44(local_c0._4_4_,iVar11 + iVar28);
                    uVar31 = 0;
                    uVar10 = local_c4;
                    local_78 = lVar32;
LAB_001a3cf5:
                    local_f4 = (u32)puVar26[(int)uVar10];
                    if ((char)puVar26[(int)uVar10] < '\0') {
                      iVar28 = sqlite3Fts5GetVarint32(puVar26 + (int)uVar10,&local_f4);
                      iVar28 = uVar10 + iVar28;
                    }
                    else {
                      iVar28 = uVar10 + 1;
                    }
                    lVar32 = local_78;
                    iVar9 = local_a4;
                    pFVar27 = local_f0;
                    bVar33 = true;
                    uVar10 = (uint)pFVar22;
                    if ((uint)local_b0 < uVar31) {
LAB_001a3e51:
                      local_d0 = (u8 *)CONCAT44(local_d0._4_4_,iVar28);
                      if (local_6c != 0) {
                        local_c4 = uVar10;
                        if (!bVar33) goto LAB_001a3e92;
                        goto LAB_001a3f49;
                      }
                      local_c4 = uVar10;
                      sqlite3_free(local_40);
                      pFVar29->pLeaf = (Fts5Data *)0x0;
                      pFVar27 = local_f0;
                      goto LAB_001a4018;
                    }
                    local_98 = pFVar22;
                    if ((uint)local_b0 == uVar31) {
                      uVar19 = (uint)local_88 - uVar31;
                      if (local_f4 < uVar19) {
                        uVar19 = local_f4;
                      }
                      if (uVar19 == 0) {
                        uVar20 = 0;
                      }
                      else {
                        uVar14 = 0;
                        do {
                          uVar20 = (uint)uVar14;
                          lVar24 = local_80;
                          if (puVar26[iVar28 + uVar20] != local_d8[uVar31 + uVar20]) break;
                          uVar14 = uVar14 + 1;
                          uVar20 = uVar19;
                        } while (uVar19 != uVar14);
                      }
                      uVar31 = uVar31 + uVar20;
                      if (uVar31 == (uint)local_88) {
                        cVar25 = (uVar20 == local_f4) + '\x01';
                      }
                      else if ((local_f4 <= uVar20) ||
                              (cVar25 = '\x01', puVar26[uVar20 + iVar28] <= local_d8[uVar31])) {
                        cVar25 = '\0';
                      }
                      if (cVar25 != '\0') {
                        if (cVar25 == '\x01') goto LAB_001a3e51;
                        local_d0 = (u8 *)CONCAT44(local_d0._4_4_,iVar28);
                        local_c4 = uVar10;
                        goto LAB_001a3f49;
                      }
                    }
                    iVar11 = (int)local_c0;
                    if (local_a4 <= (int)local_c0) {
                      bVar33 = false;
                      goto LAB_001a3e51;
                    }
                    iVar28 = sqlite3Fts5GetVarint32(puVar26 + (int)local_c0,(u32 *)&local_b0);
                    uVar19 = (int)local_98 + (uint)local_b0;
                    pFVar22 = (Fts5Buffer *)(ulong)uVar19;
                    if ((int)uVar19 < iVar9) {
                      local_c0 = CONCAT44(local_c0._4_4_,iVar11 + iVar28);
                      uVar10 = uVar19 + 1;
                      local_b0 = (u8 *)CONCAT44(local_b0._4_4_,(uint)puVar26[(int)uVar19]);
                      if ((char)puVar26[(int)uVar19] < '\0') {
                        iVar28 = sqlite3Fts5GetVarint32(puVar26 + (int)uVar19,(u32 *)&local_b0);
                        uVar10 = iVar28 + uVar19;
                      }
                      goto LAB_001a3cf5;
                    }
                    local_d0 = (u8 *)CONCAT44(local_d0._4_4_,uVar19);
                    *local_e8 = 0x10b;
                    pFVar27 = local_f0;
                    lVar32 = local_78;
                    local_c4 = uVar19;
                  }
                }
                goto LAB_001a4018;
              }
              fts5SegIterInit(local_f0,pSeg,pFVar29);
              puVar26 = local_d8;
              goto LAB_001a412c;
            }
LAB_001a42a0:
            pFVar30 = (Fts5Structure *)&pFVar30->nSegment;
          } while (pFVar30 < local_48);
        }
      }
      else if (0 < (int)uVar10) {
        pFVar6 = local_a0->aLevel;
        pFVar29 = local_b8->aSeg;
        lVar24 = (ulong)uVar10 * 0xc + -0xc;
        do {
          fts5SegIterInit(local_f0,(Fts5StructureSegment *)
                                   ((long)&(pFVar6[(uint)iLevel].aSeg)->iSegid + lVar24),pFVar29);
          lVar24 = lVar24 + -0xc;
          pFVar29 = pFVar29 + 1;
        } while (lVar24 != -0xc);
      }
    }
    pFVar7 = local_b8;
    pFVar27 = local_f0;
    if (*local_e8 == 0) {
      if (1 < local_b8->nSeg) {
        iVar28 = local_b8->nSeg + 1;
        do {
          iVar9 = fts5MultiIterDoCompare(pFVar7,iVar28 + -2);
          if (iVar9 != 0) {
            if (*local_e8 == 0) {
              (*pFVar7->aSeg[iVar9].xNext)(pFVar27,pFVar7->aSeg + iVar9,(int *)0x0);
            }
            fts5MultiIterAdvanced(pFVar27,pFVar7,iVar9,iVar28 + -2);
          }
          iVar28 = iVar28 + -1;
        } while (2 < iVar28);
      }
      uVar18 = pFVar7->aFirst[1].iFirst;
      pFVar16 = pFVar7->aSeg[uVar18].pLeaf;
      (pFVar7->base).bEof = pFVar16 == (Fts5Data *)0x0;
      pFVar7->iSwitchRowid = pFVar7->aSeg[uVar18].iRowid;
      if ((((pFVar7->bSkipEmpty != '\0') && (*local_e8 == 0)) && (pFVar16 != (Fts5Data *)0x0)) &&
         (pFVar7->aSeg[uVar18].nPos == 0)) {
        fts5MultiIterNext(pFVar27,pFVar7,0,0);
        return;
      }
      if (pFVar16 != (Fts5Data *)0x0) {
        (*pFVar7->xSetOutputs)(pFVar7,pFVar7->aSeg + uVar18);
        return;
      }
    }
    else {
      fts5MultiIterFree(local_b8);
      *local_50 = (Fts5Iter *)0x0;
    }
  }
  return;
  while( true ) {
    iVar28 = pFVar16->szLeaf;
    if (iVar28 < pFVar16->nn) break;
LAB_001a3e92:
    fts5SegIterNextPage(pFVar27,pFVar29);
    pFVar16 = pFVar29->pLeaf;
    if (pFVar16 == (Fts5Data *)0x0) goto LAB_001a4018;
  }
  puVar26 = pFVar16->p;
  local_a4 = pFVar16->nn;
  iVar9 = sqlite3Fts5GetVarint32(puVar26 + iVar28,(u32 *)&local_d0);
  uVar10 = (uint)local_d0;
  if ((3 < (long)(int)(uint)local_d0) && ((int)(uint)local_d0 < iVar28)) {
    local_c0 = CONCAT44(local_c0._4_4_,iVar9 + iVar28);
    local_b0 = (u8 *)((ulong)local_b0 & 0xffffffff00000000);
    local_c4 = (uint)local_d0;
    iVar28 = sqlite3Fts5GetVarint32(puVar26 + (int)(uint)local_d0,&local_f4);
    local_d0 = (u8 *)CONCAT44(local_d0._4_4_,iVar28 + uVar10);
LAB_001a3f49:
    uVar23 = local_f4;
    lVar21 = (long)(int)(uint)local_d0;
    iVar28 = local_f4 + (uint)local_d0;
    pFVar29->iLeafOffset = iVar28;
    if ((local_f4 != 0) && (iVar28 <= local_a4)) {
      pFVar29->iTermLeafOffset = iVar28;
      pFVar29->iTermLeafPgno = pFVar29->iLeafPgno;
      local_98 = &pFVar29->term;
      (pFVar29->term).n = 0;
      sqlite3Fts5BufferAppendBlob(local_e8,local_98,(uint)local_b0,local_d8);
      sqlite3Fts5BufferAppendBlob(local_e8,local_98,uVar23,puVar26 + lVar21);
      iVar28 = (int)local_c0;
      if ((int)local_c0 < local_a4) {
        iVar11 = sqlite3Fts5GetVarint32(puVar26 + (int)local_c0,&local_5c);
        iVar9 = local_5c + local_c4;
        iVar28 = iVar28 + iVar11;
      }
      else {
        iVar9 = pFVar29->pLeaf->nn + 1;
      }
      pFVar27 = local_f0;
      pFVar29->iEndofDoclist = iVar9;
      pFVar29->iPgidxOff = iVar28;
      fts5SegIterLoadRowid(local_f0,pFVar29);
      fts5SegIterLoadNPos(pFVar27,pFVar29);
      goto LAB_001a4018;
    }
  }
  *local_e8 = 0x10b;
  pFVar27 = local_f0;
LAB_001a4018:
  pFVar30 = local_a0;
  if (*local_e8 == 0 && local_6c == 0) {
    uVar10 = pFVar29->flags;
    pFVar29->flags = uVar10 | 1;
    if (pFVar29->pLeaf != (Fts5Data *)0x0) {
      if ((local_c8 & 2) != 0) {
        pFVar29->flags = uVar10 | 3;
      }
      if (local_60 <= local_8c && (local_d9 & 1) == 0) {
        if ((pFVar29->iTermLeafPgno != pFVar29->iLeafPgno) ||
           (pFVar29->pLeaf->szLeaf <= pFVar29->iEndofDoclist)) {
          pFVar15 = fts5DlidxIterInit(pFVar27,pFVar29->flags & 2,pFVar29->pSeg->iSegid,
                                      pFVar29->iTermLeafPgno);
          pFVar29->pDlidx = pFVar15;
        }
      }
      if ((local_c8 & 2) != 0) {
        local_78 = lVar32;
        if (pFVar29->pDlidx == (Fts5DlidxIter *)0x0) {
          uVar10 = pFVar29->iLeafPgno;
          lVar32 = (long)(int)uVar10;
          iVar28 = 4;
          if (pFVar29->iTermLeafPgno == uVar10) {
            iVar28 = pFVar29->iTermLeafOffset;
          }
          lVar21 = (long)iVar28;
          do {
            lVar1 = lVar21 + 1;
            if (-1 < (char)pFVar29->pLeaf->p[lVar21]) break;
            bVar33 = lVar21 < iVar28 + 8;
            lVar21 = lVar1;
          } while (bVar33);
          pFVar29->iLeafOffset = (int)lVar1;
          if (pFVar29->iEndofDoclist < pFVar29->pLeaf->szLeaf) {
            local_c0 = 0;
            pFVar16 = (Fts5Data *)0x0;
          }
          else {
            local_98 = (Fts5Buffer *)pFVar29->pSeg;
            local_c0 = 0;
            pFVar16 = (Fts5Data *)0x0;
            do {
              uVar10 = uVar10 + 1;
              if ((*local_e8 != 0) || (local_98->n <= lVar32)) break;
              pFVar17 = fts5DataRead(pFVar27,lVar32 + ((ulong)*(uint *)&local_98->p << 0x25) + 1);
              if (pFVar17 == (Fts5Data *)0x0) {
                bVar33 = true;
              }
              else {
                bVar33 = pFVar17->nn <= pFVar17->szLeaf;
                bVar4 = pFVar17->p[1] == '\0';
                bVar5 = *pFVar17->p == '\0';
                p_02 = pFVar16;
                if (bVar4 && bVar5) {
                  p_02 = pFVar17;
                }
                local_c0 = local_c0 & 0xffffffff;
                if (!bVar4 || !bVar5) {
                  local_c0 = (ulong)uVar10;
                  pFVar16 = pFVar17;
                }
                sqlite3_free(p_02);
              }
              lVar32 = lVar32 + 1;
              pFVar27 = local_f0;
            } while (bVar33);
          }
        }
        else {
          local_c0 = (ulong)pFVar29->pDlidx->aLvl[0].iLeafPgno;
          pFVar16 = fts5DataRead(pFVar27,((ulong)(uint)pFVar29->pSeg->iSegid << 0x25) + local_c0);
        }
        lVar32 = local_78;
        if (pFVar16 != (Fts5Data *)0x0) {
          sqlite3_free(pFVar29->pLeaf);
          pFVar29->pLeaf = pFVar16;
          pFVar29->iLeafPgno = (int)local_c0;
          uVar18 = *(ushort *)pFVar16->p;
          uVar18 = uVar18 << 8 | uVar18 >> 8;
          bVar8 = sqlite3Fts5GetVarint
                            ((uchar *)((ulong)uVar18 + (long)pFVar16->p),(u64 *)&pFVar29->iRowid);
          pFVar29->iLeafOffset = (uint)bVar8 + (uint)uVar18;
          if (pFVar16->szLeaf < pFVar16->nn) {
            sqlite3Fts5GetVarint32(pFVar16->p + pFVar16->szLeaf,(u32 *)&local_d0);
            iVar28 = (uint)local_d0;
          }
          else {
            iVar28 = pFVar16->nn + 1;
          }
          pFVar29->iEndofDoclist = iVar28;
        }
        fts5SegIterReverseInitPage(pFVar27,pFVar29);
        pFVar30 = local_a0;
      }
    }
  }
  lVar21 = local_58;
  puVar26 = local_d8;
  if ((pFVar29->flags & 2) == 0) {
    if (pFVar27->pConfig->eDetail == 1) {
      pcVar13 = fts5SegIterNext_None;
    }
    else {
      pcVar13 = fts5SegIterNext;
    }
    pFVar29->xNext = pcVar13;
  }
  else {
    pFVar29->xNext = fts5SegIterNext_Reverse;
  }
LAB_001a412c:
  lVar24 = lVar24 + 1;
  bVar33 = lVar32 < 2;
  lVar32 = lVar21;
  if (bVar33) goto LAB_001a42a0;
  goto LAB_001a3aae;
}

Assistant:

static void fts5MultiIterNew(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Structure *pStruct,         /* Structure of specific index */
  int flags,                      /* FTS5INDEX_QUERY_XXX flags */
  Fts5Colset *pColset,            /* Colset to filter on (or NULL) */
  const u8 *pTerm, int nTerm,     /* Term to seek to (or NULL/0) */
  int iLevel,                     /* Level to iterate (-1 for all) */
  int nSegment,                   /* Number of segments to merge (iLevel>=0) */
  Fts5Iter **ppOut                /* New object */
){
  int nSeg = 0;                   /* Number of segment-iters in use */
  int iIter = 0;                  /* */
  int iSeg;                       /* Used to iterate through segments */
  Fts5StructureLevel *pLvl;
  Fts5Iter *pNew;

  assert( (pTerm==0 && nTerm==0) || iLevel<0 );

  /* Allocate space for the new multi-seg-iterator. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      assert( pStruct->nSegment==fts5StructureCountSegments(pStruct) );
      nSeg = pStruct->nSegment;
      nSeg += (p->pHash ? 1 : 0);
    }else{
      nSeg = MIN(pStruct->aLevel[iLevel].nSeg, nSegment);
    }
  }
  *ppOut = pNew = fts5MultiIterAlloc(p, nSeg);
  if( pNew==0 ) return;
  pNew->bRev = (0!=(flags & FTS5INDEX_QUERY_DESC));
  pNew->bSkipEmpty = (0!=(flags & FTS5INDEX_QUERY_SKIPEMPTY));
  pNew->pColset = pColset;
  if( (flags & FTS5INDEX_QUERY_NOOUTPUT)==0 ){
    fts5IterSetOutputCb(&p->rc, pNew);
  }

  /* Initialize each of the component segment iterators. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      Fts5StructureLevel *pEnd = &pStruct->aLevel[pStruct->nLevel];
      if( p->pHash ){
        /* Add a segment iterator for the current contents of the hash table. */
        Fts5SegIter *pIter = &pNew->aSeg[iIter++];
        fts5SegIterHashInit(p, pTerm, nTerm, flags, pIter);
      }
      for(pLvl=&pStruct->aLevel[0]; pLvl<pEnd; pLvl++){
        for(iSeg=pLvl->nSeg-1; iSeg>=0; iSeg--){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          Fts5SegIter *pIter = &pNew->aSeg[iIter++];
          if( pTerm==0 ){
            fts5SegIterInit(p, pSeg, pIter);
          }else{
            fts5SegIterSeekInit(p, pTerm, nTerm, flags, pSeg, pIter);
          }
        }
      }
    }else{
      pLvl = &pStruct->aLevel[iLevel];
      for(iSeg=nSeg-1; iSeg>=0; iSeg--){
        fts5SegIterInit(p, &pLvl->aSeg[iSeg], &pNew->aSeg[iIter++]);
      }
    }
    assert( iIter==nSeg );
  }

  /* If the above was successful, each component iterators now points 
  ** to the first entry in its segment. In this case initialize the 
  ** aFirst[] array. Or, if an error has occurred, free the iterator
  ** object and set the output variable to NULL.  */
  if( p->rc==SQLITE_OK ){
    for(iIter=pNew->nSeg-1; iIter>0; iIter--){
      int iEq;
      if( (iEq = fts5MultiIterDoCompare(pNew, iIter)) ){
        Fts5SegIter *pSeg = &pNew->aSeg[iEq];
        if( p->rc==SQLITE_OK ) pSeg->xNext(p, pSeg, 0);
        fts5MultiIterAdvanced(p, pNew, iEq, iIter);
      }
    }
    fts5MultiIterSetEof(pNew);
    fts5AssertMultiIterSetup(p, pNew);

    if( pNew->bSkipEmpty && fts5MultiIterIsEmpty(p, pNew) ){
      fts5MultiIterNext(p, pNew, 0, 0);
    }else if( pNew->base.bEof==0 ){
      Fts5SegIter *pSeg = &pNew->aSeg[pNew->aFirst[1].iFirst];
      pNew->xSetOutputs(pNew, pSeg);
    }

  }else{
    fts5MultiIterFree(pNew);
    *ppOut = 0;
  }
}